

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_read_image.cxx
# Opt level: O3

Fl_RGB_Image *
traverse_to_gl_subwindows
          (Fl_Group *g,uchar *p,int x,int y,int w,int h,int alpha,Fl_RGB_Image *full_img)

{
  int iVar1;
  Fl_Widget *pFVar2;
  int w_00;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  Fl_Plugin *pFVar6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Fl_Window *pFVar7;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  Fl_RGB_Image *this;
  uchar *puVar8;
  Fl_Widget **ppFVar9;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  Fl_RGB_Image *pFVar10;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  int iVar11;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000014;
  long lVar12;
  undefined4 in_register_00000084;
  int iVar13;
  Fl_Plugin_Manager pm;
  
  iVar3 = (*(g->super_Fl_Widget)._vptr_Fl_Widget[9])();
  if (CONCAT44(extraout_var,iVar3) == 0) {
    iVar3 = (*(g->super_Fl_Widget)._vptr_Fl_Widget[8])(g);
    this = full_img;
    if (CONCAT44(extraout_var_01,iVar3) != 0) {
      puVar8 = p;
      if (full_img != (Fl_RGB_Image *)0x0) {
        pFVar7 = Fl_Widget::window(&g->super_Fl_Widget);
        if (pFVar7 == (Fl_Window *)0x0) goto LAB_001f2b3d;
        pFVar7 = Fl_Widget::window(&g->super_Fl_Widget);
        iVar3 = (*(pFVar7->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[9])(pFVar7);
        if (CONCAT44(extraout_var_02,iVar3) == 0) goto LAB_001f2b3d;
        iVar3 = (*(g->super_Fl_Widget)._vptr_Fl_Widget[8])(g);
        Fl_Window::make_current((Fl_Window *)CONCAT44(extraout_var_03,iVar3));
        puVar8 = (uchar *)0x0;
      }
      puVar8 = read_win_rectangle(puVar8,x,y,w,h,alpha);
      this = (Fl_RGB_Image *)operator_new(0x40);
      Fl_RGB_Image::Fl_RGB_Image(this,puVar8,w,h,4 - (uint)(alpha == 0),0);
      if (p == (uchar *)0x0 || full_img != (Fl_RGB_Image *)0x0) {
        this->alloc_array = 1;
      }
    }
  }
  else {
    Fl_Plugin_Manager::Fl_Plugin_Manager(&pm,"fltk:device");
    pFVar6 = Fl_Plugin_Manager::plugin(&pm,"opengl.device.fltk.org");
    if (pFVar6 == (Fl_Plugin *)0x0) {
      Fl_Plugin_Manager::~Fl_Plugin_Manager(&pm);
      return full_img;
    }
    iVar3 = (*pFVar6->_vptr_Fl_Plugin[5])
                      (pFVar6,g,CONCAT44(in_register_00000014,x),CONCAT44(in_register_0000000c,y),
                       CONCAT44(in_register_00000084,w));
    this = (Fl_RGB_Image *)CONCAT44(extraout_var_00,iVar3);
    if (full_img == (Fl_RGB_Image *)0x0) {
      puVar8 = p;
      if (p == (uchar *)0x0) {
        puVar8 = (uchar *)operator_new__((long)(int)((4 - (uint)(alpha == 0)) *
                                                     (this->super_Fl_Image).w_ *
                                                    (this->super_Fl_Image).h_));
      }
      pFVar10 = (Fl_RGB_Image *)operator_new(0x40);
      Fl_RGB_Image::Fl_RGB_Image
                (pFVar10,puVar8,(this->super_Fl_Image).w_,(this->super_Fl_Image).h_,
                 4 - (uint)(alpha == 0),0);
      if (p == (uchar *)0x0) {
        pFVar10->alloc_array = 1;
      }
      if (alpha != 0) {
        memset(puVar8,alpha,(long)((this->super_Fl_Image).w_ * (this->super_Fl_Image).h_ * 4));
      }
      write_image_inside(pFVar10,this,0,0);
      (*(this->super_Fl_Image)._vptr_Fl_Image[1])(this);
      this = pFVar10;
    }
    Fl_Plugin_Manager::~Fl_Plugin_Manager(&pm);
  }
LAB_001f2b3d:
  iVar3 = g->children_;
  if (0 < (long)iVar3) {
    lVar12 = 0;
    do {
      ppFVar9 = Fl_Group::array(g);
      pFVar2 = ppFVar9[lVar12];
      if (((pFVar2->flags_ & 2) == 0) &&
         (iVar4 = (*pFVar2->_vptr_Fl_Widget[7])(pFVar2), CONCAT44(extraout_var_04,iVar4) != 0)) {
        iVar4 = (*pFVar2->_vptr_Fl_Widget[8])(pFVar2);
        if (CONCAT44(extraout_var_05,iVar4) == 0) {
          iVar4 = (*pFVar2->_vptr_Fl_Widget[7])(pFVar2);
          traverse_to_gl_subwindows
                    ((Fl_Group *)CONCAT44(extraout_var_08,iVar4),p,x,y,w,h,alpha,this);
        }
        else {
          iVar4 = pFVar2->x_;
          iVar11 = pFVar2->y_;
          iVar13 = x;
          if (x < iVar4) {
            iVar13 = iVar4;
          }
          iVar5 = iVar4 - iVar13;
          if (x <= iVar4) {
            iVar5 = 0;
          }
          iVar4 = y;
          if (y < iVar11) {
            iVar4 = iVar11;
          }
          iVar1 = pFVar2->w_;
          w_00 = (w + x) - iVar13;
          if (iVar5 + iVar1 + iVar13 <= w + x) {
            w_00 = iVar5 + iVar1;
          }
          iVar11 = iVar11 + pFVar2->h_;
          iVar5 = iVar11 - iVar4;
          if (iVar4 + iVar1 <= iVar11) {
            iVar5 = iVar1;
          }
          iVar11 = (h + y) - iVar4;
          if (iVar5 + iVar4 <= h + y) {
            iVar11 = iVar5;
          }
          if ((0 < w_00) && (0 < iVar11)) {
            iVar5 = (*pFVar2->_vptr_Fl_Widget[8])(pFVar2);
            pFVar10 = traverse_to_gl_subwindows
                                ((Fl_Group *)CONCAT44(extraout_var_06,iVar5),p,iVar13 - pFVar2->x_,
                                 iVar4 - pFVar2->y_,w_00,iVar11,alpha,this);
            if (pFVar10 != this) {
              iVar11 = (*pFVar2->_vptr_Fl_Widget[9])(pFVar2);
              if (CONCAT44(extraout_var_07,iVar11) == 0) {
                write_image_inside(this,pFVar10,iVar13 - x,
                                   ((this->super_Fl_Image).h_ + y) -
                                   (iVar4 + (pFVar10->super_Fl_Image).h_));
              }
              else {
                write_image_inside(this,pFVar10,iVar13 - x,iVar4 - y);
                if (pFVar10 == (Fl_RGB_Image *)0x0) goto LAB_001f2d1c;
              }
              (*(pFVar10->super_Fl_Image)._vptr_Fl_Image[1])(pFVar10);
            }
          }
        }
      }
LAB_001f2d1c:
      lVar12 = lVar12 + 1;
    } while (iVar3 != lVar12);
  }
  return this;
}

Assistant:

static Fl_RGB_Image *traverse_to_gl_subwindows(Fl_Group *g, uchar *p, int x, int y, int w, int h, int alpha,
                                               Fl_RGB_Image *full_img)
{
  if ( g->as_gl_window() ) {
    Fl_Plugin_Manager pm("fltk:device");
    Fl_Device_Plugin *pi = (Fl_Device_Plugin*)pm.plugin("opengl.device.fltk.org");
    if (!pi) return full_img;
    Fl_RGB_Image *img = pi->rectangle_capture(g, x, y, w, h); // bottom to top image
    if (full_img) full_img = img; // top and bottom will be exchanged later
    else { // exchange top and bottom to get a proper FLTK image
      uchar *data = ( p ? p : new uchar[img->w() * img->h() * (alpha?4:3)] );
      full_img = new Fl_RGB_Image(data, img->w(), img->h(), alpha?4:3);
      if (!p) full_img->alloc_array = 1;
      if (alpha) memset(data, alpha, img->w() * img->h() * 4);
      write_image_inside(full_img, img, 0, 0);
      delete img;
    }
  }
  else if ( g->as_window() && (!full_img || (g->window() && g->window()->as_gl_window())) ) {
    // the starting window or one inside a GL window
    if (full_img) g->as_window()->make_current();
    uchar *image_data;
    int alloc_img = (full_img != NULL || p == NULL); // false means use p, don't alloc new memory for image
#ifdef __APPLE_CC__
    // on Darwin + X11, read_win_rectangle() sometimes returns NULL when there are subwindows
    do image_data = read_win_rectangle( (alloc_img ? NULL : p), x, y, w, h, alpha); while (!image_data);
#else
    image_data = read_win_rectangle( (alloc_img ? NULL : p), x, y, w, h, alpha);
#endif
    full_img = new Fl_RGB_Image(image_data, w, h, alpha?4:3);
    if (alloc_img) full_img->alloc_array = 1;
  }
  int n = g->children();
  for (int i = 0; i < n; i++) {
    Fl_Widget *c = g->child(i);
    if ( !c->visible() || !c->as_group()) continue;
    if ( c->as_window() ) {
      int origin_x = x; // compute intersection of x,y,w,h and the c window
      if (x < c->x()) origin_x = c->x();
      int origin_y = y;
      if (y < c->y()) origin_y = c->y();
      int width = c->w();
      if (origin_x + width > c->x() + c->w()) width = c->x() + c->w() - origin_x;
      if (origin_x + width > x + w) width = x + w - origin_x;
      int height = c->w();
      if (origin_y + height > c->y() + c->h()) height = c->y() + c->h() - origin_y;
      if (origin_y + height > y + h) height = y + h - origin_y;
      if (width > 0 && height > 0) {
        Fl_RGB_Image *img = traverse_to_gl_subwindows(c->as_window(), p, origin_x - c->x(),
                                                      origin_y - c->y(), width, height, alpha, full_img);
        if (img == full_img) continue;
        int top;
        if (c->as_gl_window()) {
          top = origin_y - y;
        } else {
          top = full_img->h() - (origin_y - y + img->h());
        }
        write_image_inside(full_img, img, origin_x - x, top);
        delete img;
      }
    }
    else traverse_to_gl_subwindows(c->as_group(), p, x, y, w, h, alpha, full_img);
  }
  return full_img;
}